

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_158 [4];
  int returnCode;
  Session session;
  char **argv_local;
  int argc_local;
  
  session.m_config.m_p = (Config *)argv;
  Catch::Session::Session((Session *)local_158);
  argv_local._4_4_ =
       Catch::Session::applyCommandLine
                 ((Session *)local_158,argc,(char **)session.m_config.m_p,Fail);
  if (argv_local._4_4_ == 0) {
    argv_local._4_4_ = Catch::Session::run((Session *)local_158);
  }
  Catch::Session::~Session((Session *)local_158);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const * const argv[]) {
    Catch::Session session; // There must be exactly once instance

    // writing to session.configData() here sets defaults
    // this is the preferred way to set them

    int returnCode = session.applyCommandLine( argc, argv );
    if( returnCode != 0 ) // Indicates a command line error
        return returnCode;

    // writing to session.configData() or session.Config() here
    // overrides command line args
    // only do this if you know you need to

    return session.run();
}